

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.h
# Opt level: O2

string * __thiscall
cmList::
Join<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
          (string *__return_storage_ptr__,cmList *this,
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          first,__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                last,string_view glue)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  string sep;
  allocator<char> local_59;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  string local_48 [32];
  
  local_58._M_str = (char *)glue._M_len;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this == first._M_current)
  {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    local_58._M_len = (size_t)last._M_current;
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (local_48,&local_58,&local_59);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
    for (pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &this[1].Values.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish; pbVar1 != first._M_current;
        pbVar1 = pbVar1 + 1) {
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
    std::__cxx11::string::~string(local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string Join(InputIterator first, InputIterator last,
                          cm::string_view glue)
  {
    if (first == last) {
      return std::string{};
    }

    const auto sep = std::string{ glue };

    std::string joined = cmList::ToString(*first);
    for (auto it = std::next(first); it != last; ++it) {
      joined += sep;
      joined += cmList::ToString(*it);
    }

    return joined;
  }